

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool string_repeat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  long lVar1;
  gravity_object_t *pgVar2;
  gravity_fiber_t *pgVar3;
  char *s;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  undefined6 in_register_00000012;
  uint uVar5;
  uint32_t len;
  uint uVar6;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1038 [4104];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_int)) {
    lVar1 = args[1].field_1.n;
    if (lVar1 - 0x400001U < 0xffffffffffc00000) {
      snprintf(local_1038,0x1000,"String.repeat() expects a value >= 1 and < %d",0x400000);
      pgVar3 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar3,local_1038);
    }
    else {
      pgVar2 = (args->field_1).p;
      len = *(int *)((long)&pgVar2->identifier + 4) * (uint)lVar1;
      s = (char *)gravity_calloc(vm,1,(ulong)(len + 1));
      if (s != (char *)0x0) {
        if (0 < lVar1) {
          uVar5 = 0;
          uVar6 = 0;
          do {
            memcpy(s + uVar5,pgVar2->objclass,(ulong)*(uint *)((long)&pgVar2->identifier + 4));
            uVar5 = uVar5 + *(int *)((long)&pgVar2->identifier + 4);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (uint)lVar1);
        }
        aVar4.p = (gravity_object_t *)gravity_string_new(vm,s,len,len);
        value_00.field_1.p = (gravity_object_t *)aVar4.n;
        value_00.isa = (aVar4.p)->isa;
        gravity_vm_setslot(vm,value_00,rindex);
        return s != (char *)0x0;
      }
    }
  }
  else {
    builtin_strncpy(local_1038 + 0x20,"er argument",0xc);
    builtin_strncpy(local_1038 + 0x10,"expects an integ",0x10);
    builtin_strncpy(local_1038,"String.repeat() ",0x10);
    pgVar3 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar3,local_1038);
  }
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool string_repeat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if ((nargs != 2) || (!VALUE_ISA_INT(GET_VALUE(1)))) {
        RETURN_ERROR("String.repeat() expects an integer argument");
    }

    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_int_t times_to_repeat = VALUE_AS_INT(GET_VALUE(1));
    if (times_to_repeat < 1 || times_to_repeat > MAX_ALLOCATION) {
        RETURN_ERROR("String.repeat() expects a value >= 1 and < %d", MAX_ALLOCATION);
    }

    // figure out the size of the array we need to make to hold the new string
    uint32_t new_size = (uint32_t)(main_str->len * times_to_repeat);
    char *new_str = mem_alloc(vm, new_size+1);
    CHECK_MEM_ALLOC(new_str);

    uint32_t seek = 0;
    for (uint32_t i = 0; i < times_to_repeat; ++i) {
        memcpy(new_str+seek, main_str->s, main_str->len);
        seek += main_str->len;
    }

    gravity_string_t *s = gravity_string_new(vm, new_str, new_size, new_size);
    RETURN_VALUE(VALUE_FROM_OBJECT(s), rindex);
}